

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_x86_movS32IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               int32_t immediate)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar4;
  undefined1 uVar5;
  size_t sStack_20;
  uint8_t instruction [11];
  uint8_t uVar3;
  
  uVar5 = (undefined1)destination;
  uVar2 = (uint8_t)immediate;
  uVar4 = (uint8_t)((uint)immediate >> 8);
  uVar3 = (uint8_t)((uint)immediate >> 0x18);
  uVar1 = (uint8_t)((uint)immediate >> 0x10);
  if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_EBP || offset != 0) {
    instruction[5] = (uint8_t)((uint)offset >> 8);
    instruction[7] = (uint8_t)((uint)offset >> 0x18);
    instruction[6] = (uint8_t)((uint)offset >> 0x10);
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      builtin_memcpy(instruction,"HǄ$",4);
      sStack_20 = 0xc;
      instruction[4] = (uint8_t)offset;
      instruction[8] = uVar2;
      instruction[9] = uVar4;
      instruction[10] = uVar1;
    }
    else {
      instruction._0_4_ = CONCAT13((uint8_t)offset,CONCAT12(uVar5,0xc748)) & 0xff07ffff | 0x800000;
      sStack_20 = 0xb;
      instruction[4] = instruction[5];
      instruction[5] = instruction[6];
      instruction[6] = instruction[7];
      instruction[7] = uVar2;
      instruction[8] = uVar4;
      instruction[9] = uVar1;
      instruction[10] = uVar3;
    }
  }
  else {
    instruction._0_4_ = CONCAT13(uVar5,CONCAT12(uVar5,0xc748)) & 0x707ffff | 0x20000000;
    sStack_20 = 8;
    instruction[4] = uVar2;
    instruction[5] = uVar4;
    instruction[6] = uVar1;
    instruction[7] = uVar3;
  }
  sysbvm_bytecodeJit_addBytes(jit,sStack_20,instruction);
  return;
}

Assistant:

static void sysbvm_jit_x86_movS32IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, int32_t immediate)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                sysbvm_jit_x86_sibOnlyBase(destination),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}